

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O2

void __thiscall FC_BPNN::~FC_BPNN(FC_BPNN *this)

{
  pointer pmVar1;
  Preceptron *this_00;
  _Base_ptr p_Var2;
  int i;
  ulong uVar3;
  
  for (uVar3 = 0;
      pmVar1 = (this->net).
               super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(this->net).
                             super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar1) / 0x30);
      uVar3 = uVar3 + 1) {
    for (p_Var2 = *(_Base_ptr *)((long)&pmVar1[uVar3]._M_t._M_impl.super__Rb_tree_header + 0x10);
        p_Var2 != &pmVar1[uVar3]._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      this_00 = (Preceptron *)p_Var2[1]._M_parent;
      if (this_00 != (Preceptron *)0x0) {
        Preceptron::~Preceptron(this_00);
      }
      operator_delete(this_00,0x98);
      p_Var2[1]._M_parent = (_Base_ptr)0x0;
    }
  }
  std::
  vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ::~vector(&this->net);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_error);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->layers_value);
  return;
}

Assistant:

FC_BPNN::~FC_BPNN()
{
	for (int i = 0; i < net.size(); i++) {
		for (auto& element : net[i]) {
			delete element.second;
			element.second = nullptr;
		}
	}
}